

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderRenderCase::computeVertexReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  float *pfVar11;
  int x;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vec4 c00;
  Vec4 color;
  Vec4 c11;
  ShaderEvalContext evalCtx;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  RGBA local_31c;
  undefined1 local_318 [16];
  undefined8 local_308;
  undefined8 uStack_300;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_2f0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  Vec4 local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  ShaderEvalContext local_240;
  
  iVar1 = result->m_width;
  iVar13 = result->m_height;
  uVar2 = quadGrid->m_gridSize;
  uVar12 = uVar2 + 1;
  local_318._8_8_ = local_318._0_8_;
  local_318._0_8_ = this;
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar9 = *(int *)(CONCAT44(extraout_var,iVar9) + 0x14);
  ShaderEvalContext::ShaderEvalContext(&local_240,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_2f0,(long)(int)(uVar12 * uVar12),(allocator_type *)&local_2b8);
  if ((ulong)uVar2 < 0x7fffffff) {
    lVar16 = 0;
    uVar15 = 0;
    do {
      local_308 = CONCAT44(local_308._4_4_,(float)(int)uVar15 / (float)(int)uVar2);
      uVar14 = 0;
      do {
        ShaderEvalContext::reset(&local_240,(float)(int)uVar14 / (float)(int)uVar2,(float)local_308)
        ;
        (**(code **)(**(long **)(local_318._0_8_ + 0x98) + 0x10))
                  (*(long **)(local_318._0_8_ + 0x98),&local_240);
        fVar18 = local_240.color.m_data[3];
        if (iVar9 < 1) {
          fVar18 = 1.0;
        }
        iVar10 = (int)lVar16 + (int)uVar14;
        local_2f0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[2] = local_240.color.m_data[2];
        *(undefined8 *)
         local_2f0.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start[iVar10].m_data = local_240.color.m_data._0_8_;
        local_2f0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[3] = fVar18;
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
      lVar16 = lVar16 + (ulong)uVar12;
      bVar17 = uVar15 != uVar2;
      uVar15 = uVar15 + 1;
    } while (bVar17);
  }
  if (0 < (int)uVar2) {
    local_2a8 = (float)(int)uVar2;
    local_288 = ZEXT416((uint)local_2a8);
    local_298 = (float)iVar13;
    uVar14 = 0;
    fStack_2a4 = local_2a8;
    fStack_2a0 = local_2a8;
    fStack_29c = local_2a8;
    fStack_294 = local_298;
    fStack_290 = local_298;
    fStack_28c = local_298;
    do {
      iVar13 = (int)uVar14;
      uVar15 = iVar13 + 1;
      auVar27._0_4_ = (float)iVar13;
      auVar27._4_4_ = (float)(int)uVar15;
      auVar27._8_8_ = 0;
      auVar28._4_4_ = fStack_2a4;
      auVar28._0_4_ = local_2a8;
      auVar28._8_4_ = fStack_2a0;
      auVar28._12_4_ = fStack_29c;
      auVar28 = divps(auVar27,auVar28);
      local_278 = auVar28._0_4_ * local_298;
      fStack_274 = auVar28._4_4_ * fStack_294;
      fStack_270 = auVar28._8_4_ * fStack_290;
      fStack_26c = auVar28._12_4_ * fStack_28c;
      fVar18 = fStack_274 - local_278;
      local_308 = CONCAT44(fStack_274 + -0.5,local_278 + -0.5);
      uStack_300 = CONCAT44(fStack_26c + 0.0,fStack_270 + 0.0);
      fVar19 = ceilf(local_278 + -0.5);
      fVar20 = ceilf(local_308._4_4_);
      local_2c8 = (ulong)(iVar13 * uVar12);
      local_2d0 = (ulong)(uVar15 * uVar12);
      local_2c0 = 0;
      local_2d8 = (ulong)uVar15;
      do {
        iVar13 = (int)local_2c0;
        local_2c0 = local_2c0 + 1;
        fVar25 = ((float)iVar13 / (float)local_288._0_4_) * (float)iVar1;
        local_318._0_4_ = ((float)(int)local_2c0 / (float)local_288._0_4_) * (float)iVar1;
        fVar21 = ceilf(fVar25 + -0.5);
        fVar22 = ceilf((float)local_318._0_4_ + -0.5);
        local_2b8 = *(undefined8 *)
                     local_2f0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_2c8 + iVar13].m_data;
        uStack_2b0 = *(undefined8 *)
                      (local_2f0.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_2c8 + iVar13].m_data + 2
                      );
        uVar7 = *(undefined8 *)
                 local_2f0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)local_2c8 + iVar13 + 1].m_data;
        uVar8 = *(undefined8 *)
                 (local_2f0.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)local_2c8 + iVar13 + 1].m_data + 2)
        ;
        local_308 = *(undefined8 *)
                     local_2f0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_2d0 + iVar13].m_data;
        uStack_300 = *(undefined8 *)
                      (local_2f0.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_2d0 + iVar13].m_data + 2
                      );
        local_258 = *(undefined8 *)
                     local_2f0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_2d0 + iVar13 + 1].m_data;
        uStack_250 = *(undefined8 *)
                      (local_2f0.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_2d0 + iVar13 + 1].m_data
                      + 2);
        if ((int)fVar19 < (int)fVar20) {
          fVar26 = (float)local_318._0_4_ - fVar25;
          iVar13 = (int)fVar19;
          do {
            if ((int)fVar21 < (int)fVar22) {
              fVar29 = (((float)iVar13 + 0.5) - local_278) * (1.0 / fVar18);
              fVar30 = 1.0;
              if (fVar29 <= 1.0) {
                fVar30 = fVar29;
              }
              fVar30 = (float)(-(uint)(0.0 < fVar29) & (uint)fVar30);
              local_318 = ZEXT416((uint)fVar30);
              fVar29 = fVar30;
              iVar9 = (int)fVar21;
              do {
                fVar23 = (((float)iVar9 + 0.5) - fVar25) * (1.0 / fVar26);
                fVar24 = 1.0;
                if (fVar23 <= 1.0) {
                  fVar24 = fVar23;
                }
                fVar24 = (float)(-(uint)(0.0 < fVar23) & (uint)fVar24);
                bVar17 = 1.0 < fVar29 + fVar24;
                pfVar11 = (float *)&local_2b8;
                if (bVar17) {
                  pfVar11 = (float *)&local_258;
                }
                local_338 = (float)uVar7;
                fStack_334 = (float)((ulong)uVar7 >> 0x20);
                fStack_330 = (float)uVar8;
                fStack_32c = (float)((ulong)uVar8 >> 0x20);
                fVar23 = (float)local_308;
                fVar31 = local_308._4_4_;
                fVar32 = (float)uStack_300;
                fVar33 = uStack_300._4_4_;
                if (bVar17) {
                  fVar24 = 1.0 - fVar24;
                  fVar23 = local_338;
                  fVar31 = fStack_334;
                  fVar32 = fStack_330;
                  fVar33 = fStack_32c;
                  fVar29 = 1.0 - fVar30;
                  fStack_32c = uStack_300._4_4_;
                  fStack_330 = (float)uStack_300;
                  fStack_334 = local_308._4_4_;
                  local_338 = (float)local_308;
                }
                fVar3 = *pfVar11;
                fVar4 = pfVar11[1];
                fVar5 = pfVar11[2];
                fVar6 = pfVar11[3];
                local_268.m_data[0] =
                     fVar29 * (fVar23 - fVar3) + fVar24 * (local_338 - fVar3) + fVar3;
                local_268.m_data[1] =
                     fVar29 * (fVar31 - fVar4) + fVar24 * (fStack_334 - fVar4) + fVar4;
                local_268.m_data[2] =
                     fVar29 * (fVar32 - fVar5) + fVar24 * (fStack_330 - fVar5) + fVar5;
                local_268.m_data[3] =
                     fVar29 * (fVar33 - fVar6) + fVar24 * (fStack_32c - fVar6) + fVar6;
                tcu::RGBA::RGBA(&local_31c,&local_268);
                *(deUint32 *)
                 ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar13 + iVar9) * 4) =
                     local_31c.m_value;
                iVar9 = iVar9 + 1;
                fVar29 = (float)local_318._0_4_;
              } while ((int)fVar22 != iVar9);
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 != (int)fVar20);
        }
      } while (local_2c0 != uVar2);
      uVar14 = local_2d8;
    } while ((uint)local_2d8 != uVar2);
  }
  if (local_2f0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderRenderCase::computeVertexReference (Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int					width		= result.getWidth();
	int					height		= result.getHeight();
	int					gridSize	= quadGrid.getGridSize();
	int					stride		= gridSize + 1;
	bool				hasAlpha	= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext	evalCtx		(quadGrid);

	// Evaluate color for each vertex.
	vector<Vec4> colors((gridSize+1)*(gridSize+1));
	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		float				sx			= (float)x / (float)gridSize;
		float				sy			= (float)y / (float)gridSize;
		int					vtxNdx		= ((y * (gridSize+1)) + x);

		evalCtx.reset(sx, sy);
		m_evaluator.evaluate(evalCtx);
		DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
		Vec4 color = evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		colors[vtxNdx] = color;
	}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		float x0 = (float)x       / (float)gridSize;
		float x1 = (float)(x + 1) / (float)gridSize;
		float y0 = (float)y       / (float)gridSize;
		float y1 = (float)(y + 1) / (float)gridSize;

		float sx0 = x0 * (float)width;
		float sx1 = x1 * (float)width;
		float sy0 = y0 * (float)height;
		float sy1 = y1 * (float)height;
		float oosx = 1.0f / (sx1 - sx0);
		float oosy = 1.0f / (sy1 - sy0);

		int ix0 = deCeilFloatToInt32(sx0 - 0.5f);
		int ix1 = deCeilFloatToInt32(sx1 - 0.5f);
		int iy0 = deCeilFloatToInt32(sy0 - 0.5f);
		int iy1 = deCeilFloatToInt32(sy1 - 0.5f);

		int		v00 = (y * stride) + x;
		int		v01 = (y * stride) + x + 1;
		int		v10 = ((y + 1) * stride) + x;
		int		v11 = ((y + 1) * stride) + x + 1;
		Vec4	c00 = colors[v00];
		Vec4	c01 = colors[v01];
		Vec4	c10 = colors[v10];
		Vec4	c11 = colors[v11];

		//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

		for (int iy = iy0; iy < iy1; iy++)
		for (int ix = ix0; ix < ix1; ix++)
		{
			DE_ASSERT(deInBounds32(ix, 0, width));
			DE_ASSERT(deInBounds32(iy, 0, height));

			float		sfx		= (float)ix + 0.5f;
			float		sfy		= (float)iy + 0.5f;
			float		fx1		= deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
			float		fy1		= deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

			// Triangle quad interpolation.
			bool		tri		= fx1 + fy1 <= 1.0f;
			float		tx		= tri ? fx1 : (1.0f-fx1);
			float		ty		= tri ? fy1 : (1.0f-fy1);
			const Vec4&	t0		= tri ? c00 : c11;
			const Vec4&	t1		= tri ? c01 : c10;
			const Vec4&	t2		= tri ? c10 : c01;
			Vec4		color	= t0 + (t1-t0)*tx + (t2-t0)*ty;

			result.setPixel(ix, iy, tcu::RGBA(color));
		}
	}
}